

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split<char>(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *__return_storage_ptr__,
             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,string *delim,
             uint limit)

{
  long lVar1;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  bool local_a9;
  value_type local_98;
  value_type local_68;
  long local_48;
  size_type newpos;
  uint local_38;
  bool crlf;
  uint pos;
  size_type l;
  string *psStack_20;
  uint limit_local;
  string *delim_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  
  l._3_1_ = 0;
  l._4_4_ = limit;
  psStack_20 = delim;
  delim_local = s;
  s_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  _pos = std::__cxx11::string::length();
  if (_pos != 0) {
    local_38 = 0;
    lVar1 = std::__cxx11::string::size();
    local_a9 = false;
    if (lVar1 == 1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)psStack_20);
      local_a9 = *pcVar2 == '\n';
    }
    newpos._7_1_ = local_a9;
    while (((local_48 = std::__cxx11::string::find((string *)delim_local,(ulong)psStack_20),
            l._4_4_ == 0 ||
            (sVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(__return_storage_ptr__), sVar3 != l._4_4_)) && (local_48 != -1))) {
      std::__cxx11::string::substr((ulong)&local_98,(ulong)delim_local);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      local_38 = (int)local_48 + (int)_pos;
      if ((((newpos._7_1_ & 1) != 0) &&
          (uVar4 = (ulong)local_38, uVar5 = std::__cxx11::string::length(), uVar4 < uVar5)) &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)delim_local), *pcVar2 == '\r')) {
        local_38 = local_38 + 1;
      }
    }
    std::__cxx11::string::substr((ulong)&local_68,(ulong)delim_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::basic_string<C>> split(const std::basic_string<C>& s,
                                        const std::string& delim = " ",
                                        unsigned limit = 0)
{
    std::vector<std::basic_string<C>> args;
    auto l = delim.length();
    if (l == 0)
        return args;
    unsigned pos = 0;
    bool crlf = (delim.size() == 1 && delim[0] == 10);
    while (true) {
        auto newpos = s.find(delim, pos);
        if ((limit && args.size() == limit) || newpos == std::string::npos) {
            args.push_back(s.substr(pos));
            break;
        }
        args.push_back(s.substr(pos, newpos - pos));
        pos = newpos + l;
        if (crlf && pos < s.length() && s[pos] == 13)
            pos++;
    }

    return args;
}